

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
google::protobuf::Symbol::parent_name_key
          (pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,Symbol *this)

{
  bool bVar1;
  Type TVar2;
  OneofDescriptor *pOVar3;
  EnumDescriptor *pEVar4;
  Descriptor *pDVar5;
  EnumValueDescriptor *pEVar6;
  ServiceDescriptor *this_00;
  MethodDescriptor *pMVar7;
  LogMessage *pLVar8;
  Descriptor *local_130;
  LogMessage local_f8;
  Voidify local_e1;
  string_view local_e0;
  ServiceDescriptor *local_d0;
  string_view local_c8;
  FileDescriptor *local_b8;
  string_view local_b0;
  EnumDescriptor *local_a0;
  string_view local_98;
  void *local_88;
  string_view local_80;
  void *local_70;
  string_view local_68;
  Descriptor *local_58;
  string_view local_50;
  void *local_40;
  FieldDescriptor *local_38;
  FieldDescriptor *field;
  void *local_20;
  anon_class_8_1_8991fb9c local_18;
  anon_class_8_1_8991fb9c or_file;
  Symbol *this_local;
  
  local_18.this = this;
  or_file.this = this;
  TVar2 = type(this);
  switch(TVar2) {
  case MESSAGE:
    pDVar5 = descriptor(this);
    pDVar5 = Descriptor::containing_type(pDVar5);
    local_20 = parent_name_key::anon_class_8_1_8991fb9c::operator()(&local_18,pDVar5);
    pDVar5 = descriptor(this);
    _field = Descriptor::name(pDVar5);
    std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_20,
               (basic_string_view<char,_std::char_traits<char>_> *)&field);
    break;
  case FIELD:
    local_38 = field_descriptor(this);
    bVar1 = FieldDescriptor::is_extension(local_38);
    if (bVar1) {
      local_130 = FieldDescriptor::extension_scope(local_38);
    }
    else {
      local_130 = FieldDescriptor::containing_type(local_38);
    }
    local_40 = parent_name_key::anon_class_8_1_8991fb9c::operator()(&local_18,local_130);
    local_50 = FieldDescriptor::name(local_38);
    std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_40,&local_50);
    break;
  case ONEOF:
    pOVar3 = oneof_descriptor(this);
    local_58 = OneofDescriptor::containing_type(pOVar3);
    pOVar3 = oneof_descriptor(this);
    local_68 = OneofDescriptor::name(pOVar3);
    std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<const_google::protobuf::Descriptor_*,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_58,&local_68);
    break;
  case ENUM:
    pEVar4 = enum_descriptor(this);
    pDVar5 = EnumDescriptor::containing_type(pEVar4);
    local_70 = parent_name_key::anon_class_8_1_8991fb9c::operator()(&local_18,pDVar5);
    pEVar4 = enum_descriptor(this);
    local_80 = EnumDescriptor::name(pEVar4);
    std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_70,&local_80);
    break;
  case ENUM_VALUE:
    pEVar6 = enum_value_descriptor(this);
    pEVar4 = EnumValueDescriptor::type(pEVar6);
    pDVar5 = EnumDescriptor::containing_type(pEVar4);
    local_88 = parent_name_key::anon_class_8_1_8991fb9c::operator()(&local_18,pDVar5);
    pEVar6 = enum_value_descriptor(this);
    local_98 = EnumValueDescriptor::name(pEVar6);
    std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_88,&local_98);
    break;
  case ENUM_VALUE_OTHER_PARENT:
    pEVar6 = enum_value_descriptor(this);
    local_a0 = EnumValueDescriptor::type(pEVar6);
    pEVar6 = enum_value_descriptor(this);
    local_b0 = EnumValueDescriptor::name(pEVar6);
    std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<const_google::protobuf::EnumDescriptor_*,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_a0,&local_b0);
    break;
  case SERVICE:
    local_b8 = GetFile(this);
    this_00 = service_descriptor(this);
    local_c8 = ServiceDescriptor::name(this_00);
    std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<const_google::protobuf::FileDescriptor_*,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_b8,&local_c8);
    break;
  case METHOD:
    pMVar7 = method_descriptor(this);
    local_d0 = MethodDescriptor::service(pMVar7);
    pMVar7 = method_descriptor(this);
    local_e0 = MethodDescriptor::name(pMVar7);
    std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<const_google::protobuf::ServiceDescriptor_*,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_d0,&local_e0);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x343,"false");
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_e1,pLVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<const void*, absl::string_view> parent_name_key() const {
    const auto or_file = [&](const void* p) { return p ? p : GetFile(); };
    switch (type()) {
      case MESSAGE:
        return {or_file(descriptor()->containing_type()), descriptor()->name()};
      case FIELD: {
        auto* field = field_descriptor();
        return {or_file(field->is_extension() ? field->extension_scope()
                                              : field->containing_type()),
                field->name()};
      }
      case ONEOF:
        return {oneof_descriptor()->containing_type(),
                oneof_descriptor()->name()};
      case ENUM:
        return {or_file(enum_descriptor()->containing_type()),
                enum_descriptor()->name()};
      case ENUM_VALUE:
        return {or_file(enum_value_descriptor()->type()->containing_type()),
                enum_value_descriptor()->name()};
      case ENUM_VALUE_OTHER_PARENT:
        return {enum_value_descriptor()->type(),
                enum_value_descriptor()->name()};
      case SERVICE:
        return {GetFile(), service_descriptor()->name()};
      case METHOD:
        return {method_descriptor()->service(), method_descriptor()->name()};
      default:
        ABSL_CHECK(false);
    }
    return {};
  }